

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O0

void __thiscall
MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure
          (MockUnexpectedCallHappenedFailure *this,UtestShell *test,SimpleString *name,
          MockExpectedCallsList *expectations)

{
  int iVar1;
  char *pcVar2;
  SimpleString local_70;
  SimpleString local_60;
  undefined1 local_50 [8];
  SimpleString ordinalNumber;
  uint amountOfActualCalls;
  MockExpectedCallsList *expectations_local;
  SimpleString *name_local;
  UtestShell *test_local;
  MockUnexpectedCallHappenedFailure *this_local;
  
  MockFailure::MockFailure(&this->super_MockFailure,test);
  (this->super_MockFailure).super_TestFailure._vptr_TestFailure =
       (_func_int **)&PTR__MockUnexpectedCallHappenedFailure_00187bd8;
  iVar1 = (*expectations->_vptr_MockExpectedCallsList[4])(expectations,name);
  if (iVar1 == 0) {
    SimpleString::SimpleString(&local_70,"Mock Failure: Unexpected call to function: ");
    SimpleString::operator=(&(this->super_MockFailure).super_TestFailure.message_,&local_70);
    SimpleString::~SimpleString(&local_70);
  }
  else {
    StringFromOrdinalNumber((uint)local_50);
    pcVar2 = SimpleString::asCharString((SimpleString *)local_50);
    StringFromFormat((char *)&local_60,"Mock Failure: Unexpected additional (%s) call to function: "
                     ,pcVar2);
    SimpleString::operator=(&(this->super_MockFailure).super_TestFailure.message_,&local_60);
    SimpleString::~SimpleString(&local_60);
    SimpleString::~SimpleString((SimpleString *)local_50);
  }
  SimpleString::operator+=(&(this->super_MockFailure).super_TestFailure.message_,name);
  SimpleString::operator+=(&(this->super_MockFailure).super_TestFailure.message_,"\n");
  MockFailure::addExpectationsAndCallHistory(&this->super_MockFailure,expectations);
  return;
}

Assistant:

MockUnexpectedCallHappenedFailure::MockUnexpectedCallHappenedFailure(UtestShell* test, const SimpleString& name, const MockExpectedCallsList& expectations) : MockFailure(test)
{
    unsigned int amountOfActualCalls = expectations.amountOfActualCallsFulfilledFor(name);
    if (amountOfActualCalls > 0) {
        SimpleString ordinalNumber = StringFromOrdinalNumber(amountOfActualCalls + 1);
        message_ = StringFromFormat("Mock Failure: Unexpected additional (%s) call to function: ", ordinalNumber.asCharString());
    } else {
        message_ = "Mock Failure: Unexpected call to function: ";
    }
    message_ += name;
    message_ += "\n";
    addExpectationsAndCallHistory(expectations);
}